

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

char * helicsInputGetInjectionUnits(HelicsInput ipt)

{
  HelicsInput pvVar1;
  string *psVar2;
  
  pvVar1 = (HelicsInput)0x0;
  if ((ipt != (HelicsInput)0x0) && (*ipt == 0x3456e052)) {
    pvVar1 = ipt;
  }
  if (pvVar1 == (HelicsInput)0x0) {
    psVar2 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar2 = helics::Interface::getInjectionUnits_abi_cxx11_(*(Interface **)((long)pvVar1 + 0x18));
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* helicsInputGetInjectionUnits(HelicsInput ipt)
{
    auto* inpObj = verifyInput(ipt, nullptr);
    if (inpObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& units = inpObj->inputPtr->getInjectionUnits();
        return units.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}